

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O0

void lws_service_do_ripe_rxflow(lws_context_per_thread *pt)

{
  lws_dll2 *plVar1;
  int iVar2;
  lws_dll2 **wsi_00;
  lws_log_cx *cx;
  lws *wsi;
  lws_dll2 *d1;
  lws_dll2 *d;
  pollfd pfd;
  lws_context_per_thread *pt_local;
  
  if ((pt->dll_buflist_owner).head != (lws_dll2 *)0x0) {
    plVar1 = (pt->dll_buflist_owner).head;
    pfd = (pollfd)pt;
    while (d1 = plVar1, d1 != (lws_dll2 *)0x0) {
      plVar1 = d1->next;
      wsi_00 = &d1[-0x18].next;
      d._4_2_ = 1;
      d._6_2_ = 1;
      d._0_4_ = 0xffffffff;
      cx = lwsl_wsi_get_cx((lws *)wsi_00);
      _lws_log_cx(cx,lws_log_prepend_wsi,wsi_00,0x10,"lws_service_do_ripe_rxflow",
                  "rxflow processing: fc=%d, 0x%lx",(uint)(*(char *)&d1[0x18].owner != '\0'),
                  (ulong)*(uint *)((long)&d1[0x16].next + 4));
      if ((*(char *)&d1[0x18].owner == '\0') &&
         (((ulong)d1[0x16].next & 0xffff00000000) != 0x11000000000)) {
        *(byte *)((long)pfd + 0x19b) = *(byte *)((long)pfd + 0x19b) & 0xfd | 2;
        iVar2 = (*(code *)(&(d1[0xc].next)->owner->tail)
                          [(int)((*(byte *)((long)&d1[0xc].next[1].prev + 2) & 0xf) - 1)])
                          (pfd,wsi_00,&d);
        if (iVar2 == 6) {
          lws_close_free_wsi((lws *)wsi_00,LWS_CLOSE_STATUS_NOSTATUS,"close_and_handled");
        }
        *(byte *)((long)pfd + 0x19b) = *(byte *)((long)pfd + 0x19b) & 0xfd;
      }
    }
  }
  return;
}

Assistant:

void
lws_service_do_ripe_rxflow(struct lws_context_per_thread *pt)
{
	struct lws_pollfd pfd;

	if (!pt->dll_buflist_owner.head)
		return;

	/*
	 * service all guys with pending rxflow that reached a state they can
	 * accept the pending data
	 */

	lws_pt_lock(pt, __func__);

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
				   pt->dll_buflist_owner.head) {
		struct lws *wsi = lws_container_of(d, struct lws, dll_buflist);

		pfd.events = LWS_POLLIN;
		pfd.revents = LWS_POLLIN;
		pfd.fd = -1;

		lwsl_wsi_debug(wsi, "rxflow processing: fc=%d, 0x%lx",
				    lws_is_flowcontrolled(wsi),
				    (unsigned long)wsi->wsistate);

		if (!lws_is_flowcontrolled(wsi) &&
		    lwsi_state(wsi) != LRS_DEFERRING_ACTION) {
			pt->inside_lws_service = 1;

			if (lws_rops_func_fidx(wsi->role_ops,
					       LWS_ROPS_handle_POLLIN).
						handle_POLLIN(pt, wsi, &pfd) ==
						   LWS_HPI_RET_PLEASE_CLOSE_ME)
				lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
						"close_and_handled");
			pt->inside_lws_service = 0;
		}

	} lws_end_foreach_dll_safe(d, d1);

	lws_pt_unlock(pt);
}